

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int tcu::anon_unknown_75::channelToInt(deUint8 *value,ChannelType type)

{
  float fVar1;
  ChannelType type_local;
  deUint8 *value_local;
  
  switch(type) {
  case SNORM_INT8:
    value_local._4_4_ = (uint)(char)*value;
    break;
  case SNORM_INT16:
    value_local._4_4_ = (uint)*(short *)value;
    break;
  case SNORM_INT32:
    value_local._4_4_ = *(uint *)value;
    break;
  case UNORM_INT8:
    value_local._4_4_ = (uint)*value;
    break;
  case UNORM_INT16:
    value_local._4_4_ = (uint)*(ushort *)value;
    break;
  case UNORM_INT24:
    value_local._4_4_ = readUint24(value);
    break;
  case UNORM_INT32:
    value_local._4_4_ = *(uint *)value;
    break;
  default:
    value_local._4_4_ = 0;
    break;
  case SIGNED_INT8:
    value_local._4_4_ = (uint)(char)*value;
    break;
  case SIGNED_INT16:
    value_local._4_4_ = (uint)*(short *)value;
    break;
  case SIGNED_INT32:
    value_local._4_4_ = *(uint *)value;
    break;
  case UNSIGNED_INT8:
    value_local._4_4_ = (uint)*value;
    break;
  case UNSIGNED_INT16:
    value_local._4_4_ = (uint)*(ushort *)value;
    break;
  case UNSIGNED_INT24:
    value_local._4_4_ = readUint24(value);
    break;
  case UNSIGNED_INT32:
    value_local._4_4_ = *(uint *)value;
    break;
  case HALF_FLOAT:
    fVar1 = deFloat16To32(*(deFloat16 *)value);
    value_local._4_4_ = (uint)fVar1;
    break;
  case FLOAT:
    value_local._4_4_ = (uint)*(float *)value;
    break;
  case FLOAT64:
    value_local._4_4_ = (uint)*(double *)value;
  }
  return value_local._4_4_;
}

Assistant:

inline int channelToInt (const deUint8* value, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			return (int)*((const deInt8*)value);
		case TextureFormat::SNORM_INT16:		return (int)*((const deInt16*)value);
		case TextureFormat::SNORM_INT32:		return (int)*((const deInt32*)value);
		case TextureFormat::UNORM_INT8:			return (int)*((const deUint8*)value);
		case TextureFormat::UNORM_INT16:		return (int)*((const deUint16*)value);
		case TextureFormat::UNORM_INT24:		return (int)readUint24(value);
		case TextureFormat::UNORM_INT32:		return (int)*((const deUint32*)value);
		case TextureFormat::SIGNED_INT8:		return (int)*((const deInt8*)value);
		case TextureFormat::SIGNED_INT16:		return (int)*((const deInt16*)value);
		case TextureFormat::SIGNED_INT32:		return (int)*((const deInt32*)value);
		case TextureFormat::UNSIGNED_INT8:		return (int)*((const deUint8*)value);
		case TextureFormat::UNSIGNED_INT16:		return (int)*((const deUint16*)value);
		case TextureFormat::UNSIGNED_INT24:		return (int)readUint24(value);
		case TextureFormat::UNSIGNED_INT32:		return (int)*((const deUint32*)value);
		case TextureFormat::HALF_FLOAT:			return (int)deFloat16To32(*(const deFloat16*)value);
		case TextureFormat::FLOAT:				return (int)*((const float*)value);
		case TextureFormat::FLOAT64:			return (int)*((const double*)value);
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}